

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

uint check_for_inscrip_with_int(object *obj,char *inscrip,int *ival)

{
  size_t sVar1;
  char *pcVar2;
  ushort **ppuVar3;
  long lVar4;
  int local_4c;
  long inarg;
  char *s;
  size_t inlen;
  uint i;
  int *ival_local;
  char *inscrip_local;
  object *obj_local;
  
  inlen._4_4_ = 0;
  sVar1 = strlen(inscrip);
  if (obj->note == 0) {
    obj_local._4_4_ = 0;
  }
  else {
    inarg = (long)quark_str(obj->note);
    if ((char *)inarg == (char *)0x0) {
      obj_local._4_4_ = 0;
    }
    else {
      do {
        pcVar2 = strstr((char *)inarg,inscrip);
        if (pcVar2 == (char *)0x0) break;
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)pcVar2[sVar1]] & 0x800) != 0) {
          if (inlen._4_4_ == 0) {
            lVar4 = strtol(pcVar2 + sVar1,(char **)0x0,10);
            if (lVar4 < 0x7fffffff) {
              local_4c = (int)lVar4;
            }
            else {
              local_4c = 0x7fffffff;
            }
            *ival = local_4c;
          }
          inlen._4_4_ = inlen._4_4_ + 1;
        }
        inarg = (long)(pcVar2 + 1);
      } while ((char *)inarg != (char *)0x0);
      obj_local._4_4_ = inlen._4_4_;
    }
  }
  return obj_local._4_4_;
}

Assistant:

unsigned check_for_inscrip_with_int(const struct object *obj, const char *inscrip, int* ival)
{
	unsigned i = 0;
	size_t inlen = strlen(inscrip);
	const char *s;

	if (!obj->note) return 0;

	s = quark_str(obj->note);

	/* Needing this implies there are bad instances of obj->note around,
	 * but I haven't been able to track down their origins - NRM */
	if (!s) return 0;

	do {
		s = strstr(s, inscrip);
		if (!s) break;
		if (isdigit(s[inlen])) {
			if (i == 0) {
				long inarg = strtol(s + inlen, 0, 10);

				*ival = (inarg < INT_MAX) ? (int) inarg : INT_MAX;
			}
			i++;
		}
		s++;
	} while (s);

	return i;
}